

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  float repeat_delay;
  float repeat_rate;
  
  pIVar4 = GetKeyData(key);
  if ((pIVar4->Down == true) && (fVar1 = pIVar4->DownDuration, 0.0 <= fVar1)) {
    bVar2 = fVar1 == 0.0;
    if ((flags & 1U) != 0 && !bVar2) {
      repeat_delay = (GImGui->IO).KeyRepeatDelay;
      if ((flags & 0xeU) == 8) {
        repeat_delay = repeat_delay * 0.72;
        repeat_rate = (GImGui->IO).KeyRepeatRate * 0.3;
      }
      else if ((flags & 0xeU) == 4) {
        repeat_delay = repeat_delay * 0.72;
        repeat_rate = (GImGui->IO).KeyRepeatRate * 0.8;
      }
      else {
        repeat_rate = (GImGui->IO).KeyRepeatRate;
      }
      if (fVar1 <= repeat_delay) {
        return false;
      }
      iVar3 = GetKeyPressedAmount(key,repeat_delay,repeat_rate);
      bVar2 = 0 < iVar3;
    }
    if (bVar2) {
      bVar2 = TestKeyOwner(key,owner_id);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!

    bool pressed = (t == 0.0f);
    if (!pressed && ((flags & ImGuiInputFlags_Repeat) != 0))
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}